

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void generate_code(CompiledCommand *ccmd,CodeGenerator *codegen)

{
  bool bVar1;
  BinaryWriter *this;
  unsigned_short *puVar2;
  reference varg;
  ushort uVar3;
  variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
  *arg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  *__range1;
  undefined1 local_20 [8];
  CodeGenerator *pCStack_18;
  optional<uint16_t> opcode;
  CodeGenerator *codegen_local;
  CompiledCommand *ccmd_local;
  
  pCStack_18 = codegen;
  std::experimental::optional<unsigned_short>::optional((optional<unsigned_short> *)(local_20 + 4));
  if (pCStack_18->oatc != (CustomHeaderOATC *)0x0) {
    CustomHeaderOATC::find_opcode((CustomHeaderOATC *)local_20,(Command *)pCStack_18->oatc);
    std::experimental::optional<unsigned_short>::operator=
              ((optional<unsigned_short> *)(local_20 + 4),(optional<unsigned_short> *)local_20);
  }
  bVar1 = std::experimental::operator==(local_20 + 4);
  if (bVar1) {
    std::experimental::optional<unsigned_short>::operator=
              ((optional<unsigned_short> *)(local_20 + 4),&ccmd->command->id);
  }
  bVar1 = std::experimental::operator==(local_20 + 4);
  if (bVar1) {
    ProgramContext::fatal_error<tag_nocontext_t,std::__cxx11::string_const&>
              (pCStack_18->program,(tag_nocontext_t *)&nocontext,
               "could not compile command {}, no id or no hash [-moatc]",&ccmd->command->name);
  }
  this = &pCStack_18->bw;
  puVar2 = std::experimental::optional<unsigned_short>::operator*
                     ((optional<unsigned_short> *)(local_20 + 4));
  uVar3 = 0;
  if ((ccmd->not_flag & 1U) != 0) {
    uVar3 = 0x8000;
  }
  BinaryWriter::emplace_u16(this,*puVar2 | uVar3);
  __end1 = std::
           vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
           ::begin(&ccmd->args);
  arg = (variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
         *)std::
           vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
           ::end(&ccmd->args);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_*,_std::vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>_>
                                     *)&arg), bVar1) {
    varg = __gnu_cxx::
           __normal_iterator<const_eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_*,_std::vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>_>
           ::operator*(&__end1);
    generate_code(varg,pCStack_18);
    __gnu_cxx::
    __normal_iterator<const_eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_*,_std::vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

inline void generate_code(const CompiledCommand& ccmd, CodeGenerator& codegen)
{
    optional<uint16_t> opcode;

    if(codegen.oatc)
        opcode = codegen.oatc->find_opcode(ccmd.command);

    if(opcode == nullopt)
        opcode = ccmd.command.id;

    if(opcode == nullopt)
        codegen.program.fatal_error(nocontext, "could not compile command {}, no id or no hash [-moatc]", ccmd.command.name);

    codegen.bw.emplace_u16(*opcode | (ccmd.not_flag? 0x8000 : 0x0000));
    for(auto& arg : ccmd.args) ::generate_code(arg, codegen);
}